

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cs_impl::
cni_helper<std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&),std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&)>
::_call<0,1,2>(cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&)>
               *this,vector *args,sequence<0,_1,_2> *param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  var *in_stack_000000b0;
  var *in_stack_000000c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&)>
  *in_stack_ffffffffffffffc8;
  
  __args_1 = in_RDI;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  try_convert_and_check<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
  ::convert(in_stack_000000c0);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,1);
  try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::convert
            (in_stack_000000c0);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,2);
  try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_2UL>::convert
            (in_stack_000000b0);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&)>
  ::operator()(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(numeric *)__args_1,
               (numeric *)in_RDI);
  pbVar1 = type_convertor<std::__cxx11::string,std::__cxx11::string>::convert<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffffc0);
  std::__cxx11::string::string((string *)in_RDI,(string *)pbVar1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return __args_1;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}